

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_factory.hpp
# Opt level: O3

auto_ptr<iutest::Test> __thiscall
iutest::detail::
iuFactory<iu_StringSplitLvalue_x_iutest_x_chain_at_first_by_single_char_Test<wchar_t>_>::Create
          (iuFactory<iu_StringSplitLvalue_x_iutest_x_chain_at_first_by_single_char_Test<wchar_t>_>
           *this)

{
  Test *pTVar1;
  EVP_PKEY_CTX *in_RSI;
  
  pTVar1 = (Test *)operator_new(0x30);
  (pTVar1->m_random).m_engine.m_v3 = 0;
  (pTVar1->m_random).m_engine.m_v4 = 0;
  *(undefined8 *)&pTVar1->m_random_seed = 0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__Test_002ac160;
  pTVar1->test_info_ = (TestInfo *)0x0;
  pTVar1->m_test_info = (iuITestInfoMediator *)0x0;
  (pTVar1->m_random).m_engine.m_v3 = 0x6c078965;
  (pTVar1->m_random).m_engine.m_v1 = 0x2016830a;
  (pTVar1->m_random).m_engine.m_v2 = 0x714acb3e;
  iuRandom::init(&pTVar1->m_random,in_RSI);
  pTVar1->m_random_seed = 0;
  Test::Observer<void>::s_current = pTVar1;
  pTVar1->_vptr_Test = (_func_int **)&PTR__Test_002ae2a8;
  (this->super_iuFactoryBase)._vptr_iuFactoryBase = (_func_int **)pTVar1;
  return (auto_ptr<iutest::Test>)(Test *)this;
}

Assistant:

virtual auto_ptr<Test> Create() IUTEST_CXX_OVERRIDE
    {
        auto_ptr<Test> p( new Tester() );
        return p;
    }